

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEnumVal.cpp
# Opt level: O0

void processDatatypeValidator(DatatypeValidator *dtValidator,bool margin)

{
  bool bVar1;
  ValidatorType VVar2;
  int iVar3;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *this;
  XMLSize_t XVar4;
  ostream *poVar5;
  KVStringPair *this_00;
  XMLCh *toTranscode;
  char16_t *pcVar6;
  StrX local_f0;
  ulong local_e8;
  XMLSize_t i_1;
  XMLSize_t enumLength;
  RefVectorOf<char16_t> *enums;
  StrX local_c8;
  XMLCh *local_c0;
  XMLCh *key_1;
  XMLSize_t len;
  XMLSize_t len_1;
  XMLCh *key;
  KVStringPair *curPair;
  undefined1 local_88 [8];
  RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> enumFacets;
  RefVectorOf<char16_t> sortedList;
  XMLSize_t i;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *facets;
  bool margin_local;
  DatatypeValidator *dtValidator_local;
  
  if (dtValidator != (DatatypeValidator *)0x0) {
    if (margin) {
      std::operator<<((ostream *)&std::cout,"\t");
    }
    std::operator<<((ostream *)&std::cout,"Base Datatype:\t\t");
    VVar2 = xercesc_4_0::DatatypeValidator::getType(dtValidator);
    switch(VVar2) {
    case String:
      std::operator<<((ostream *)&std::cout,"string");
      break;
    case AnyURI:
      std::operator<<((ostream *)&std::cout,"AnyURI");
      break;
    case QName:
      std::operator<<((ostream *)&std::cout,"QName");
      break;
    case Name:
      std::operator<<((ostream *)&std::cout,"Name");
      break;
    case NCName:
      std::operator<<((ostream *)&std::cout,"NCName");
      break;
    case Boolean:
      std::operator<<((ostream *)&std::cout,"Boolean");
      break;
    case Float:
      std::operator<<((ostream *)&std::cout,"Float");
      break;
    case Double:
      std::operator<<((ostream *)&std::cout,"Double");
      break;
    case Decimal:
      std::operator<<((ostream *)&std::cout,"Decimal");
      break;
    case HexBinary:
      std::operator<<((ostream *)&std::cout,"HexBinary");
      break;
    case Base64Binary:
      std::operator<<((ostream *)&std::cout,"Base64Binary");
      break;
    case Duration:
      std::operator<<((ostream *)&std::cout,"Duration");
      break;
    case DateTime:
      std::operator<<((ostream *)&std::cout,"DateTime");
      break;
    case Date:
      std::operator<<((ostream *)&std::cout,"Date");
      break;
    case Time:
      std::operator<<((ostream *)&std::cout,"Time");
      break;
    case MonthDay:
      std::operator<<((ostream *)&std::cout,"MonthDay");
      break;
    case YearMonth:
      std::operator<<((ostream *)&std::cout,"YearMonth");
      break;
    case Year:
      std::operator<<((ostream *)&std::cout,"Year");
      break;
    case Month:
      std::operator<<((ostream *)&std::cout,"Month");
      break;
    case Day:
      std::operator<<((ostream *)&std::cout,"Day");
      break;
    case ID:
      std::operator<<((ostream *)&std::cout,"ID");
      break;
    case IDREF:
      std::operator<<((ostream *)&std::cout,"IDREF");
      break;
    case ENTITY:
      std::operator<<((ostream *)&std::cout,"ENTITY");
      break;
    case NOTATION:
      std::operator<<((ostream *)&std::cout,"NOTATION");
      break;
    case List:
      std::operator<<((ostream *)&std::cout,"List");
      break;
    case Union:
      std::operator<<((ostream *)&std::cout,"Union");
      break;
    case AnySimpleType:
      std::operator<<((ostream *)&std::cout,"AnySimpleType");
      break;
    case UnKnown:
      std::operator<<((ostream *)&std::cout,"UNKNOWN");
    }
    std::operator<<((ostream *)&std::cout,"\n");
    this = xercesc_4_0::DatatypeValidator::getFacets(dtValidator);
    if ((this != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) &&
       (XVar4 = xercesc_4_0::RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
                getCount(this), XVar4 != 0)) {
      std::operator<<((ostream *)&std::cout,"Facets:\t\t\n");
      XVar4 = xercesc_4_0::RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
              getCount(this);
      xercesc_4_0::RefVectorOf<char16_t>::RefVectorOf
                ((RefVectorOf<char16_t> *)&enumFacets.fMemoryManager,XVar4,false,
                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      xercesc_4_0::RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
      RefHashTableOfEnumerator
                ((RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
                 local_88,this,false,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      while (bVar1 = xercesc_4_0::
                     RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>
                     ::hasMoreElements((RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>
                                        *)local_88), bVar1) {
        key = (XMLCh *)xercesc_4_0::
                       RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>
                       ::nextElement((RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>
                                      *)local_88);
        len_1 = (XMLSize_t)xercesc_4_0::KVStringPair::getKey((KVStringPair *)key);
        len = xercesc_4_0::BaseRefVectorOf<char16_t>::size
                        ((BaseRefVectorOf<char16_t> *)&enumFacets.fMemoryManager);
        for (sortedList.super_BaseRefVectorOf<char16_t>.fMemoryManager = (MemoryManager *)0x0;
            XVar4 = len_1, sortedList.super_BaseRefVectorOf<char16_t>.fMemoryManager < len;
            sortedList.super_BaseRefVectorOf<char16_t>.fMemoryManager =
                 sortedList.super_BaseRefVectorOf<char16_t>.fMemoryManager + 1) {
          pcVar6 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt
                             ((BaseRefVectorOf<char16_t> *)&enumFacets.fMemoryManager,
                              (XMLSize_t)sortedList.super_BaseRefVectorOf<char16_t>.fMemoryManager);
          iVar3 = xercesc_4_0::XMLString::compareString((wchar16 *)XVar4,pcVar6);
          if (iVar3 < 0) {
            xercesc_4_0::BaseRefVectorOf<char16_t>::insertElementAt
                      ((BaseRefVectorOf<char16_t> *)&enumFacets.fMemoryManager,(char16_t *)len_1,
                       (XMLSize_t)sortedList.super_BaseRefVectorOf<char16_t>.fMemoryManager);
            break;
          }
        }
        if (sortedList.super_BaseRefVectorOf<char16_t>.fMemoryManager == (MemoryManager *)len) {
          xercesc_4_0::BaseRefVectorOf<char16_t>::addElement
                    ((BaseRefVectorOf<char16_t> *)&enumFacets.fMemoryManager,(char16_t *)len_1);
        }
      }
      key_1 = (XMLCh *)xercesc_4_0::BaseRefVectorOf<char16_t>::size
                                 ((BaseRefVectorOf<char16_t> *)&enumFacets.fMemoryManager);
      for (sortedList.super_BaseRefVectorOf<char16_t>.fMemoryManager = (MemoryManager *)0x0;
          sortedList.super_BaseRefVectorOf<char16_t>.fMemoryManager < key_1;
          sortedList.super_BaseRefVectorOf<char16_t>.fMemoryManager =
               sortedList.super_BaseRefVectorOf<char16_t>.fMemoryManager + 1) {
        local_c0 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt
                             ((BaseRefVectorOf<char16_t> *)&enumFacets.fMemoryManager,
                              (XMLSize_t)sortedList.super_BaseRefVectorOf<char16_t>.fMemoryManager);
        poVar5 = std::operator<<((ostream *)&std::cout,"\t");
        StrX::StrX(&local_c8,local_c0);
        poVar5 = operator<<(poVar5,&local_c8);
        poVar5 = std::operator<<(poVar5,"=");
        this_00 = xercesc_4_0::RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>
                  ::get(this,local_c0);
        toTranscode = xercesc_4_0::KVStringPair::getValue(this_00);
        StrX::StrX((StrX *)&enums,toTranscode);
        poVar5 = operator<<(poVar5,(StrX *)&enums);
        std::operator<<(poVar5,"\n");
        StrX::~StrX((StrX *)&enums);
        StrX::~StrX(&local_c8);
      }
      xercesc_4_0::RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
      ~RefHashTableOfEnumerator
                ((RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
                 local_88);
      xercesc_4_0::RefVectorOf<char16_t>::~RefVectorOf
                ((RefVectorOf<char16_t> *)&enumFacets.fMemoryManager);
    }
    enumLength = (**(code **)(*(long *)dtValidator + 0x30))();
    if (enumLength != 0) {
      std::operator<<((ostream *)&std::cout,"Enumeration:\t\t\n");
      i_1 = xercesc_4_0::BaseRefVectorOf<char16_t>::size((BaseRefVectorOf<char16_t> *)enumLength);
      for (local_e8 = 0; local_e8 < i_1; local_e8 = local_e8 + 1) {
        poVar5 = std::operator<<((ostream *)&std::cout,"\t");
        pcVar6 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt
                           ((BaseRefVectorOf<char16_t> *)enumLength,local_e8);
        StrX::StrX(&local_f0,pcVar6);
        poVar5 = operator<<(poVar5,&local_f0);
        std::operator<<(poVar5,"\n");
        StrX::~StrX(&local_f0);
      }
    }
  }
  return;
}

Assistant:

void processDatatypeValidator( const DatatypeValidator* dtValidator, bool margin )
{
    if( !dtValidator )
    {
        return;
    }

    if( margin )
    {
        std::cout << "\t";
    }

    std::cout << "Base Datatype:\t\t";
    switch( dtValidator->getType() )
    {
    case DatatypeValidator::String:         std::cout << "string";      break;
    case DatatypeValidator::AnyURI:         std::cout << "AnyURI";      break;
    case DatatypeValidator::QName:          std::cout << "QName";       break;
    case DatatypeValidator::Name:           std::cout << "Name";        break;
    case DatatypeValidator::NCName:         std::cout << "NCName";      break;
    case DatatypeValidator::Boolean:        std::cout << "Boolean";     break;
    case DatatypeValidator::Float:          std::cout << "Float";       break;
    case DatatypeValidator::Double:         std::cout << "Double";      break;
    case DatatypeValidator::Decimal:        std::cout << "Decimal";     break;
    case DatatypeValidator::HexBinary:      std::cout << "HexBinary";   break;
    case DatatypeValidator::Base64Binary:   std::cout << "Base64Binary";break;
    case DatatypeValidator::Duration:       std::cout << "Duration";    break;
    case DatatypeValidator::DateTime:       std::cout << "DateTime";    break;
    case DatatypeValidator::Date:           std::cout << "Date";        break;
    case DatatypeValidator::Time:           std::cout << "Time";        break;
    case DatatypeValidator::MonthDay:       std::cout << "MonthDay";    break;
    case DatatypeValidator::YearMonth:      std::cout << "YearMonth";   break;
    case DatatypeValidator::Year:           std::cout << "Year";        break;
    case DatatypeValidator::Month:          std::cout << "Month";       break;
    case DatatypeValidator::Day:            std::cout << "Day";         break;
    case DatatypeValidator::ID:             std::cout << "ID";          break;
    case DatatypeValidator::IDREF:          std::cout << "IDREF";       break;
    case DatatypeValidator::ENTITY:         std::cout << "ENTITY";      break;
    case DatatypeValidator::NOTATION:       std::cout << "NOTATION";    break;
    case DatatypeValidator::List:           std::cout << "List";        break;
    case DatatypeValidator::Union:          std::cout << "Union";       break;
    case DatatypeValidator::AnySimpleType:  std::cout << "AnySimpleType"; break;
    case DatatypeValidator::UnKnown:        std::cout << "UNKNOWN";     break;
    }

    std::cout << "\n";

    // Facets
	RefHashTableOf<KVStringPair>* facets = dtValidator->getFacets();
    if( facets && facets->getCount()>0)
    {
        XMLSize_t i;
        // Element's properties
        std::cout << "Facets:\t\t\n";
        // use a list to print them sorted, or the list could be different on 64-bit machines
        RefVectorOf<XMLCh> sortedList(facets->getCount(), false);
        RefHashTableOfEnumerator<KVStringPair> enumFacets(facets);
        while( enumFacets.hasMoreElements() )
        {
            const KVStringPair& curPair = enumFacets.nextElement();
            const XMLCh* key=curPair.getKey();
            XMLSize_t len=sortedList.size();
            for(i=0;i<len;i++)
                if(XMLString::compareString(key, sortedList.elementAt(i))<0)
                {
                    sortedList.insertElementAt((XMLCh*)key,i);
                    break;
                }
            if(i==len)
                sortedList.addElement((XMLCh*)key);
        }

        XMLSize_t len=sortedList.size();
        for(i=0;i<len;i++)
        {
            const XMLCh* key = sortedList.elementAt(i);
            std::cout << "\t" << StrX( key )    << "="
                         << StrX( facets->get(key)->getValue() )  << "\n";
        }
    }

	// Enumerations
	RefVectorOf<XMLCh>* enums = (RefVectorOf<XMLCh>*) dtValidator->getEnumString();
	if (enums)
	{
		std::cout << "Enumeration:\t\t\n";

		XMLSize_t enumLength = enums->size();
		for ( XMLSize_t i = 0; i < enumLength; i++)
        {
            std::cout << "\t" << StrX( enums->elementAt(i)) << "\n";
        }

	}
}